

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Writer::WriteHRR(OSTEI_HRR_Writer *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DoubletType DVar4;
  ostream *poVar5;
  ostream *poVar6;
  int *piVar7;
  OSTEI_HRR_Algorithm_Base *in_RSI;
  long in_RDI;
  int L_1;
  int L;
  DoubletType steptype;
  QAM am;
  iterator __end1_1;
  iterator __begin1_1;
  QAMList *__range1_1;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMSet *__range1;
  QAM finalam;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffff958;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  QAM *in_stack_fffffffffffff980;
  QAM *in_stack_fffffffffffff9a8;
  ostream *in_stack_fffffffffffffa40;
  QAM *in_stack_fffffffffffffa48;
  QAM *in_stack_fffffffffffffa90;
  ostream *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  QAM *in_stack_fffffffffffffaf0;
  OSTEI_HRR_Writer *in_stack_fffffffffffffb00;
  QAM *in_stack_fffffffffffffb70;
  ostream *in_stack_fffffffffffffb78;
  OSTEI_HRR_Writer *in_stack_fffffffffffffb80;
  allocator local_419;
  string local_418 [32];
  string local_3f8 [136];
  QAM *in_stack_fffffffffffffc90;
  ostream *in_stack_fffffffffffffc98;
  OSTEI_HRR_Writer *in_stack_fffffffffffffca0;
  allocator local_341;
  string local_340 [32];
  string local_320 [32];
  QAM *in_stack_fffffffffffffd00;
  ostream *in_stack_fffffffffffffd08;
  OSTEI_HRR_Writer *in_stack_fffffffffffffd10;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_290;
  undefined1 local_288 [24];
  undefined1 *local_270;
  allocator local_231;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [87];
  allocator local_199;
  string local_198 [32];
  string local_178 [32];
  string local_158 [87];
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  reference local_a0;
  _Self local_98;
  _Self local_90;
  undefined1 local_88 [48];
  undefined1 *local_58;
  OSTEI_HRR_Algorithm_Base *local_10;
  
  local_10 = in_RSI;
  GeneratorInfoBase::FinalAM((GeneratorInfoBase *)in_stack_fffffffffffff958);
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent3_abi_cxx11_);
  std::operator<<(poVar5,"//////////////////////////////////////////////\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent3_abi_cxx11_);
  std::operator<<(poVar5,"// Contracted integrals: Horizontal recurrance\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent3_abi_cxx11_);
  std::operator<<(poVar5,"//////////////////////////////////////////////\n");
  std::operator<<((ostream *)local_10,"\n\n");
  bVar1 = OSTEI_HRR_Algorithm_Base::HasBraHRR((OSTEI_HRR_Algorithm_Base *)0x14a95b);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)local_10,(string *)indent3_abi_cxx11_);
    std::operator<<(poVar5,"const double hAB[3] = { P.AB_x[ab], P.AB_y[ab], P.AB_z[ab] };\n");
  }
  std::operator<<((ostream *)local_10,"\n\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent3_abi_cxx11_);
  std::operator<<(poVar5,"for(abcd = 0; abcd < nshellbatch; ++abcd, ++real_abcd)\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent3_abi_cxx11_);
  std::operator<<(poVar5,"{\n");
  bVar1 = OSTEI_HRR_Algorithm_Base::HasKetHRR((OSTEI_HRR_Algorithm_Base *)0x14aa4f);
  if (bVar1) {
    in_stack_fffffffffffffb00 =
         (OSTEI_HRR_Writer *)std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
    std::operator<<((ostream *)in_stack_fffffffffffffb00,
                    "const double hCD[3] = { Q.AB_x[cd+abcd], Q.AB_y[cd+abcd], Q.AB_z[cd+abcd] };\n"
                   );
  }
  std::operator<<((ostream *)local_10,"\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
  std::operator<<(poVar5,"// set up HRR pointers\n");
  OSTEI_HRR_Algorithm_Base::TopAM(in_stack_fffffffffffff958);
  local_58 = local_88;
  local_90._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffff958);
  local_98._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)in_stack_fffffffffffff958);
  while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
    local_a0 = std::_Rb_tree_const_iterator<QAM>::operator*
                         ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff960);
    in_stack_fffffffffffffaf0 =
         (QAM *)std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
    poVar6 = std::operator<<((ostream *)in_stack_fffffffffffffaf0,"double const * restrict ");
    HRRVarName_abi_cxx11_(in_stack_fffffffffffff9a8);
    poVar6 = std::operator<<(poVar6,local_c0);
    poVar6 = std::operator<<(poVar6," = ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"",&local_101);
    ArrVarName(in_stack_fffffffffffffa48,(string *)in_stack_fffffffffffffa40);
    poVar6 = std::operator<<(poVar6,local_e0);
    poVar6 = std::operator<<(poVar6," + abcd * ");
    QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
    iVar2 = NCART(in_stack_fffffffffffff980);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
    std::operator<<(poVar6,";\n");
    QAM::~QAM((QAM *)0x14ad17);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string(local_c0);
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffff960);
  }
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x14ab60);
  iVar2 = GeneratorInfoBase::Deriv(*(GeneratorInfoBase **)(in_RDI + 0x10));
  if (iVar2 == 0) {
    in_stack_fffffffffffffa98 = std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
    in_stack_fffffffffffffa90 =
         (QAM *)std::operator<<(in_stack_fffffffffffffa98,"double * restrict ");
    HRRVarName_abi_cxx11_(in_stack_fffffffffffff9a8);
    poVar6 = std::operator<<((ostream *)in_stack_fffffffffffffa90,local_158);
    poVar6 = std::operator<<(poVar6," = ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"",&local_199);
    ArrVarName(in_stack_fffffffffffffa48,(string *)in_stack_fffffffffffffa40);
    poVar6 = std::operator<<(poVar6,local_178);
    poVar6 = std::operator<<(poVar6," + real_abcd * ");
    QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
    iVar3 = NCART(in_stack_fffffffffffff980);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    std::operator<<(poVar6,";\n");
    QAM::~QAM((QAM *)0x14afef);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::__cxx11::string::~string(local_158);
  }
  else {
    iVar3 = GeneratorInfoBase::Deriv(*(GeneratorInfoBase **)(in_RDI + 0x10));
    if (iVar3 == 1) {
      in_stack_fffffffffffffa48 =
           (QAM *)std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
      in_stack_fffffffffffffa40 =
           std::operator<<((ostream *)in_stack_fffffffffffffa48,"double * restrict ");
      HRRVarName_abi_cxx11_(in_stack_fffffffffffff9a8);
      poVar6 = std::operator<<(in_stack_fffffffffffffa40,local_1f0);
      poVar6 = std::operator<<(poVar6," = ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"",&local_231);
      ArrVarName(in_stack_fffffffffffffa48,(string *)in_stack_fffffffffffffa40);
      poVar6 = std::operator<<(poVar6,local_210);
      poVar6 = std::operator<<(poVar6," + real_abcd * ");
      QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
      iVar3 = NCART(in_stack_fffffffffffff980);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      std::operator<<(poVar6," * 12;\n");
      QAM::~QAM((QAM *)0x14b294);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      std::__cxx11::string::~string(local_1f0);
    }
  }
  std::operator<<((ostream *)local_10,"\n");
  OSTEI_HRR_Algorithm_Base::GetAMOrder(in_stack_fffffffffffff958);
  local_270 = local_288;
  local_290._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                        ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff958);
  std::vector<QAM,_std::allocator<QAM>_>::end
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffff958);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffff960,
                            (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffff958), bVar1) {
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator*
              (&local_290);
    QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
    QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
    DVar4 = OSTEI_HRR_Algorithm_Base::GetDoubletStep
                      (in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
    QAM::~QAM((QAM *)0x14b48f);
    if (DVar4 == BRA) {
      poVar6 = std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"// form ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"",&local_341);
      ArrVarName(in_stack_fffffffffffffa48,(string *)in_stack_fffffffffffffa40);
      poVar6 = std::operator<<(poVar6,local_320);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      piVar7 = QAM::operator[]((QAM *)in_stack_fffffffffffff960,
                               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
      iVar3 = *piVar7;
      piVar7 = QAM::operator[]((QAM *)in_stack_fffffffffffff960,
                               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
      if (iVar3 + *piVar7 < *(int *)(in_RDI + 0x18)) {
        QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
        WriteHRR_Bra_Inline_
                  ((OSTEI_HRR_Writer *)CONCAT44(iVar2,in_stack_fffffffffffffaa0),
                   in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        QAM::~QAM((QAM *)0x14b646);
      }
      else if (iVar3 + *piVar7 < *(int *)(in_RDI + 0x1c)) {
        QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
        WriteHRR_Bra_External_
                  (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
        QAM::~QAM((QAM *)0x14b796);
      }
      else {
        QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
        WriteHRR_Bra_General_
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        QAM::~QAM((QAM *)0x14b80e);
      }
      std::operator<<((ostream *)local_10,"\n");
    }
    else {
      poVar6 = std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"// form ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"",&local_419);
      ArrVarName(in_stack_fffffffffffffa48,(string *)in_stack_fffffffffffffa40);
      poVar6 = std::operator<<(poVar6,local_3f8);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_3f8);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      piVar7 = QAM::operator[]((QAM *)in_stack_fffffffffffff960,
                               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
      in_stack_fffffffffffff974 = *piVar7;
      piVar7 = QAM::operator[]((QAM *)in_stack_fffffffffffff960,
                               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
      if (in_stack_fffffffffffff974 + *piVar7 < *(int *)(in_RDI + 0x18)) {
        QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)in_stack_fffffffffffff958);
        WriteHRR_Ket_Inline_(in_stack_fffffffffffffb00,poVar5,in_stack_fffffffffffffaf0);
        QAM::~QAM((QAM *)0x14b9d9);
      }
      else if (in_stack_fffffffffffff974 + *piVar7 < *(int *)(in_RDI + 0x1c)) {
        in_stack_fffffffffffff960 = local_10;
        QAM::QAM((QAM *)local_10,(QAM *)in_stack_fffffffffffff958);
        WriteHRR_Ket_External_
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        QAM::~QAM((QAM *)0x14bad1);
      }
      else {
        in_stack_fffffffffffff958 = local_10;
        QAM::QAM((QAM *)in_stack_fffffffffffff960,(QAM *)local_10);
        WriteHRR_Ket_General_
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        QAM::~QAM((QAM *)0x14bb47);
      }
      std::operator<<((ostream *)local_10,"\n");
    }
    QAM::~QAM((QAM *)0x14bb93);
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (&local_290);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)
             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  QAM::~QAM((QAM *)0x14bbce);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR(std::ostream & os) const
{
    QAM finalam = info_.FinalAM();

    os << indent3 << "//////////////////////////////////////////////\n";
    os << indent3 << "// Contracted integrals: Horizontal recurrance\n";
    os << indent3 << "//////////////////////////////////////////////\n";
    os << "\n\n";

    if(hrr_algo_.HasBraHRR())
        os << indent3 << "const double hAB[3] = { P.AB_x[ab], P.AB_y[ab], P.AB_z[ab] };\n"; 
    os << "\n\n";

    os << indent3 << "for(abcd = 0; abcd < nshellbatch; ++abcd, ++real_abcd)\n";
    os << indent3 << "{\n";

    if(hrr_algo_.HasKetHRR())
        os << indent4 << "const double hCD[3] = { Q.AB_x[cd+abcd], Q.AB_y[cd+abcd], Q.AB_z[cd+abcd] };\n";
    os << "\n";
    os << indent4 << "// set up HRR pointers\n";
    for(const auto & it : hrr_algo_.TopAM())
        os << indent4 << "double const * restrict " << HRRVarName(it) << " = " << ArrVarName(it) << " + abcd * " << NCART(it) << ";\n";

    // and also for the final integral
    if(info_.Deriv() == 0)
        os << indent4 << "double * restrict " << HRRVarName(finalam) << " = " << ArrVarName(finalam) << " + real_abcd * " << NCART(finalam) << ";\n";
    else if(info_.Deriv() == 1)
        os << indent4 << "double * restrict " << HRRVarName(finalam) << " = " << ArrVarName(finalam) << " + real_abcd * " << NCART(finalam) << " * 12;\n";
    os << "\n";

    for(auto am : hrr_algo_.GetAMOrder())
    {
        DoubletType steptype = hrr_algo_.GetDoubletStep(am);

        if(steptype == DoubletType::BRA)
        {
            os << indent4 << "// form " << ArrVarName(am) << "\n";
            int L = am[0] + am[1];

            if(L < start_external_)
                WriteHRR_Bra_Inline_(os, am);
            else if(L < start_general_)
                WriteHRR_Bra_External_(os, am);
            else
                WriteHRR_Bra_General_(os, am);
            os << "\n";
        }
        else
        {
            os << indent4 << "// form " << ArrVarName(am) << "\n";
            int L = am[2] + am[3];

            if(L < start_external_)
                WriteHRR_Ket_Inline_(os, am);
            else if(L < start_general_)
                WriteHRR_Ket_External_(os, am);
            else
                WriteHRR_Ket_General_(os, am);
            os << "\n";
        }
    }

}